

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

uint __thiscall spv::Builder::getNumTypeConstituents(Builder *this,Id typeId)

{
  Op OVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  uint uVar4;
  
  ppIVar2 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar3 = ppIVar2[typeId];
  OVar1 = pIVar3->opCode;
  uVar4 = 1;
  if ((int)OVar1 < 0x1168) {
    switch(OVar1) {
    case OpTypeBool:
    case OpTypeInt:
    case OpTypeFloat:
    case OpTypePointer:
      goto switchD_003d6d9e_caseD_14;
    case OpTypeVector:
    case OpTypeMatrix:
      if ((*(pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 2) == 0) {
        return (pIVar3->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[1];
      }
      goto LAB_003d6e14;
    default:
switchD_003d6d9e_caseD_19:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x579,"unsigned int spv::Builder::getNumTypeConstituents(Id) const");
    case OpTypeArray:
      goto switchD_003d6d9e_caseD_1c;
    case OpTypeStruct:
      uVar4 = Instruction::getNumOperands(pIVar3);
      return uVar4;
    }
  }
  if (OVar1 != OpTypeCooperativeMatrixKHR) {
    if (OVar1 != OpTypeCooperativeVectorNV) {
      if (OVar1 == OpTypeCooperativeMatrixNV) {
        return 1;
      }
      goto switchD_003d6d9e_caseD_19;
    }
switchD_003d6d9e_caseD_1c:
    if ((*(pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 2) == 0) {
      __assert_fail("idOperand[op]",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                    ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
    }
    pIVar3 = ppIVar2[(pIVar3->operands).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[1]];
    if ((**(byte **)&(pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 1) != 0) {
LAB_003d6e14:
      __assert_fail("!idOperand[op]",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                    ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
    }
    uVar4 = *(pIVar3->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
switchD_003d6d9e_caseD_14:
  return uVar4;
}

Assistant:

unsigned int Builder::getNumTypeConstituents(Id typeId) const
{
    Instruction* instr = module.getInstruction(typeId);

    switch (instr->getOpCode())
    {
    case OpTypeBool:
    case OpTypeInt:
    case OpTypeFloat:
    case OpTypePointer:
        return 1;
    case OpTypeVector:
    case OpTypeMatrix:
        return instr->getImmediateOperand(1);
    case OpTypeCooperativeVectorNV:
    case OpTypeArray:
    {
        Id lengthId = instr->getIdOperand(1);
        return module.getInstruction(lengthId)->getImmediateOperand(0);
    }
    case OpTypeStruct:
        return instr->getNumOperands();
    case OpTypeCooperativeMatrixKHR:
    case OpTypeCooperativeMatrixNV:
        // has only one constituent when used with OpCompositeConstruct.
        return 1;
    default:
        assert(0);
        return 1;
    }
}